

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *handler)

{
  null_terminating_iterator<char> it_00;
  iterator it_01;
  char cVar1;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  *handler_00;
  char *last;
  char *pcVar2;
  char *ptr;
  null_terminating_iterator<char> it_02;
  iterator iVar3;
  internal *local_b0;
  char *local_a8;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  local_80;
  internal *local_78;
  char *local_70;
  null_terminating_iterator<char> local_68;
  undefined1 local_58 [8];
  null_terminating_iterator<char> it;
  char *p;
  char *end;
  char *begin;
  writer write;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *handler_local;
  basic_string_view<char> format_str_local;
  
  begin = (char *)format_str.size_;
  format_str_local.data_ = format_str.data_;
  write.handler_ =
       (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)begin;
  handler_local =
       (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)this;
  end = basic_string_view<char>::data((basic_string_view<char> *)&handler_local);
  handler_00 = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                *)basic_string_view<char>::size((basic_string_view<char> *)&handler_local);
  last = end + (long)handler_00;
  do {
    while( true ) {
      it.end_._7_1_ = 0x7b;
      pcVar2 = find<false,char_const*,char>(end,last,(char *)((long)&it.end_ + 7));
      if (pcVar2 == last) {
        parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&>
        ::writer::operator()((writer *)&begin,end,last);
        return;
      }
      parse_format_string<false,_char,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&>
      ::writer::operator()((writer *)&begin,end,pcVar2);
      ptr = pcVar2 + 1;
      if ((ptr == last) || (*ptr != '{')) break;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_text(write.handler_,ptr,pcVar2 + 2);
      end = pcVar2 + 2;
    }
    null_terminating_iterator<char>::null_terminating_iterator
              ((null_terminating_iterator<char> *)local_58,ptr,last);
    local_78 = (internal *)local_58;
    local_70 = it.ptr_;
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
    ::id_adapter(&local_80,write.handler_);
    it_02.end_ = (char *)&local_80;
    it_02.ptr_ = local_70;
    local_68 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                         (local_78,it_02,handler_00);
    local_58 = (undefined1  [8])local_68.ptr_;
    it.ptr_ = local_68.end_;
    cVar1 = null_terminating_iterator<char>::operator*((null_terminating_iterator<char> *)local_58);
    if (cVar1 == '}') {
      it_01.end_ = it.ptr_;
      it_01.ptr_ = (char *)local_58;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_replacement_field(write.handler_,it_01);
    }
    else {
      cVar1 = null_terminating_iterator<char>::operator*
                        ((null_terminating_iterator<char> *)local_58);
      if (cVar1 != ':') {
        error_handler::on_error((error_handler *)write.handler_,"missing \'}\' in format string");
        return;
      }
      null_terminating_iterator<char>::operator++((null_terminating_iterator<char> *)local_58);
      iVar3.end_ = it.ptr_;
      iVar3.ptr_ = (char *)local_58;
      iVar3 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::on_format_specs(write.handler_,iVar3);
      local_b0 = (internal *)iVar3.ptr_;
      local_58 = (undefined1  [8])local_b0;
      local_a8 = iVar3.end_;
      it.ptr_ = local_a8;
      cVar1 = null_terminating_iterator<char>::operator*
                        ((null_terminating_iterator<char> *)local_58);
      if (cVar1 != '}') {
        error_handler::on_error((error_handler *)write.handler_,"unknown format specifier");
        return;
      }
    }
    it_00.end_ = it.ptr_;
    it_00.ptr_ = (char *)local_58;
    pcVar2 = pointer_from<char>(it_00);
    end = pcVar2 + 1;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      for (;;) {
        auto p = find<IS_CONSTEXPR>(begin, end, '}');
        if (p == end) {
          handler_.on_text(begin, end);
          return;
        }
        ++p;
        if (p == end || *p != '}') {
          handler_.on_error("unmatched '}' in format string");
          return;
        }
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  for (;;) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on long format strings.
    auto p = find<IS_CONSTEXPR>(begin, end, '{');
    if (p == end) {
      write(begin, end);
      return;
    }
    write(begin, p);
    ++p;
    if (p != end && *p == '{') {
      handler.on_text(p, p + 1);
      begin = p + 1;
      continue;
    }

    internal::null_terminating_iterator<Char> it(p, end);
    it = parse_arg_id(it, id_adapter<Handler, Char>(handler));
    if (*it == '}') {
      handler.on_replacement_field(it);
    } else if (*it == ':') {
      ++it;
      it = handler.on_format_specs(it);
      if (*it != '}') {
        handler.on_error("unknown format specifier");
        return;
      }
    } else {
      handler.on_error("missing '}' in format string");
      return;
    }
    begin = pointer_from(it) + 1;
  }
}